

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_histogram.cpp
# Opt level: O3

void duckdb::HistogramBinFunction::
     Combine<duckdb::HistogramBinState<duckdb::string_t>,duckdb::HistogramBinFunction>
               (HistogramBinState<duckdb::string_t> *source,
               HistogramBinState<duckdb::string_t> *target,AggregateInputData *input_data)

{
  unsafe_vector<duckdb::string_t> *puVar1;
  unsafe_vector<duckdb::string_t> *puVar2;
  pointer psVar3;
  pointer puVar4;
  pointer puVar5;
  pointer puVar6;
  bool bVar7;
  vector<duckdb::string_t,_std::allocator<duckdb::string_t>_> *this;
  unsafe_vector<idx_t> *puVar8;
  NotImplementedException *this_00;
  InternalException *this_01;
  long lVar9;
  long lVar10;
  pointer r;
  pointer this_02;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  puVar1 = source->bin_boundaries;
  if (puVar1 != (unsafe_vector<duckdb::string_t> *)0x0) {
    puVar2 = target->bin_boundaries;
    if (puVar2 == (unsafe_vector<duckdb::string_t> *)0x0) {
      this = (vector<duckdb::string_t,_std::allocator<duckdb::string_t>_> *)operator_new(0x18);
      (this->super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (this->super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (this->super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      target->bin_boundaries = (unsafe_vector<duckdb::string_t> *)this;
      puVar8 = (unsafe_vector<idx_t> *)operator_new(0x18);
      (puVar8->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (puVar8->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (puVar8->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      target->counts = puVar8;
      std::vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>::operator=
                (this,&source->bin_boundaries->
                       super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                (&target->counts->super_vector<unsigned_long,_std::allocator<unsigned_long>_>,
                 &source->counts->super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
      return;
    }
    this_02 = (puVar2->super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>).
              super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>._M_impl.
              super__Vector_impl_data._M_start;
    psVar3 = (puVar2->super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>).
             super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>._M_impl.
             super__Vector_impl_data._M_finish;
    r = (puVar1->super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>).
        super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>._M_impl.
        super__Vector_impl_data._M_start;
    if ((long)psVar3 - (long)this_02 !=
        (long)(puVar1->super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>).
              super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)r) {
LAB_00587740:
      this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,
                 "Histogram - cannot combine histograms with different bin boundaries. Bin boundaries must be the same for all histograms within the same group"
                 ,"");
      duckdb::NotImplementedException::NotImplementedException(this_00,(string *)local_50);
      __cxa_throw(this_00,&NotImplementedException::typeinfo,std::runtime_error::~runtime_error);
    }
    if (this_02 != psVar3) {
      do {
        bVar7 = string_t::operator==(this_02,r);
        if (!bVar7) break;
        this_02 = this_02 + 1;
        r = r + 1;
      } while (this_02 != psVar3);
      if (!bVar7) goto LAB_00587740;
    }
    puVar4 = (target->counts->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar5 = (target->counts->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    lVar9 = (long)puVar5 - (long)puVar4;
    puVar6 = (source->counts->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (lVar9 != (long)(source->counts->super_vector<unsigned_long,_std::allocator<unsigned_long>_>)
                       .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)puVar6) {
      this_01 = (InternalException *)__cxa_allocate_exception(0x10);
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,
                 "Histogram combine - bin boundaries are the same but counts are different","");
      duckdb::InternalException::InternalException(this_01,(string *)local_50);
      __cxa_throw(this_01,&InternalException::typeinfo,std::runtime_error::~runtime_error);
    }
    if (puVar5 != puVar4) {
      lVar9 = lVar9 >> 3;
      lVar10 = 0;
      do {
        puVar4[lVar10] = puVar4[lVar10] + puVar6[lVar10];
        lVar10 = lVar10 + 1;
      } while (lVar9 + (ulong)(lVar9 == 0) != lVar10);
    }
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &input_data) {
		if (!source.bin_boundaries) {
			// nothing to combine
			return;
		}
		if (!target.bin_boundaries) {
			// target does not have bin boundaries - copy everything over
			target.bin_boundaries = new unsafe_vector<typename STATE::TYPE>();
			target.counts = new unsafe_vector<idx_t>();
			*target.bin_boundaries = *source.bin_boundaries;
			*target.counts = *source.counts;
		} else {
			// both source and target have bin boundaries
			if (*target.bin_boundaries != *source.bin_boundaries) {
				throw NotImplementedException(
				    "Histogram - cannot combine histograms with different bin boundaries. "
				    "Bin boundaries must be the same for all histograms within the same group");
			}
			if (target.counts->size() != source.counts->size()) {
				throw InternalException("Histogram combine - bin boundaries are the same but counts are different");
			}
			D_ASSERT(target.counts->size() == source.counts->size());
			for (idx_t bin_idx = 0; bin_idx < target.counts->size(); bin_idx++) {
				(*target.counts)[bin_idx] += (*source.counts)[bin_idx];
			}
		}
	}